

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

Mat3x3d * __thiscall OpenMD::Thermo::getBoundingBox(Mat3x3d *__return_storage_ptr__,Thermo *this)

{
  Snapshot *this_00;
  int i_1;
  Molecule *pMVar1;
  long lVar2;
  pointer ppRVar3;
  pointer ppAVar4;
  Atom *this_01;
  RigidBody *this_02;
  int iVar5;
  double dVar6;
  double dVar7;
  MoleculeIterator i;
  Vector3d bMax;
  Vector3d bMin;
  Vector3d pos;
  Mat3x3d bBox;
  MoleculeIterator local_c8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  RectMatrix<double,_3U,_3U> local_78;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasBoundingBox == false) {
    local_c8._M_node = (_Base_ptr)0x0;
    Vector<double,_3U>::Vector(&local_90);
    Vector<double,_3U>::Vector(&local_c0);
    Vector<double,_3U>::Vector(&local_a8);
    pMVar1 = SimInfo::beginMolecule(this->info_,&local_c8);
    iVar5 = 0;
    while (pMVar1 != (Molecule *)0x0) {
      ppRVar3 = (pMVar1->rigidBodies_).
                super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppRVar3 !=
          (pMVar1->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_001599be;
      this_02 = (RigidBody *)0x0;
      while (this_02 != (RigidBody *)0x0) {
        RigidBody::updateAtoms(this_02);
        ppRVar3 = ppRVar3 + 1;
        this_02 = (RigidBody *)0x0;
        if (ppRVar3 !=
            (pMVar1->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
LAB_001599be:
          this_02 = *ppRVar3;
        }
      }
      ppAVar4 = (pMVar1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppAVar4 !=
          (pMVar1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) goto LAB_00159a49;
      this_01 = (Atom *)0x0;
      while (this_01 != (Atom *)0x0) {
        StuntDouble::getPos((Vector3d *)&local_78,&this_01->super_StuntDouble);
        Vector<double,_3U>::operator=(&local_90,(Vector<double,_3U> *)&local_78);
        if (iVar5 == 0) {
          Vector<double,_3U>::operator=(&local_c0,&local_90);
          Vector<double,_3U>::operator=(&local_a8,&local_90);
        }
        else {
          for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
            dVar6 = local_90.data_[lVar2];
            dVar7 = dVar6;
            if (dVar6 <= local_c0.data_[lVar2]) {
              dVar7 = local_c0.data_[lVar2];
            }
            local_c0.data_[lVar2] = dVar7;
            if (local_a8.data_[lVar2] <= dVar6) {
              dVar6 = local_a8.data_[lVar2];
            }
            local_a8.data_[lVar2] = dVar6;
          }
        }
        iVar5 = iVar5 + 1;
        ppAVar4 = ppAVar4 + 1;
        this_01 = (Atom *)0x0;
        if (ppAVar4 !=
            (pMVar1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
LAB_00159a49:
          this_01 = *ppAVar4;
        }
      }
      pMVar1 = SimInfo::nextMolecule(this->info_,&local_c8);
    }
    RectMatrix<double,_3U,_3U>::RectMatrix(&local_78,0.0);
    for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 8) {
      *(double *)((long)local_78.data_[0] + lVar2 * 4) =
           *(double *)((long)local_c0.data_ + lVar2) - *(double *)((long)local_a8.data_ + lVar2);
    }
    Snapshot::setBoundingBox(this_00,(Mat3x3d *)&local_78);
  }
  Snapshot::getBoundingBox(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d Thermo::getBoundingBox() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!(snap->hasBoundingBox)) {
      SimInfo::MoleculeIterator i;
      Molecule::RigidBodyIterator ri;
      Molecule::AtomIterator ai;
      Molecule* mol;
      RigidBody* rb;
      Atom* atom;
      Vector3d pos, bMax, bMin;
      int index = 0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        // change the positions of atoms which belong to the rigidbodies
        for (rb = mol->beginRigidBody(ri); rb != NULL;
             rb = mol->nextRigidBody(ri)) {
          rb->updateAtoms();
        }

        for (atom = mol->beginAtom(ai); atom != NULL;
             atom = mol->nextAtom(ai)) {
          pos = atom->getPos();

          if (index == 0) {
            bMax = pos;
            bMin = pos;
          } else {
            for (int i = 0; i < 3; i++) {
              bMax[i] = max(bMax[i], pos[i]);
              bMin[i] = min(bMin[i], pos[i]);
            }
          }
          index++;
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &bMax[0], 3, MPI_REALTYPE, MPI_MAX,
                    MPI_COMM_WORLD);

      MPI_Allreduce(MPI_IN_PLACE, &bMin[0], 3, MPI_REALTYPE, MPI_MIN,
                    MPI_COMM_WORLD);
#endif
      Mat3x3d bBox = Mat3x3d(0.0);
      for (int i = 0; i < 3; i++) {
        bBox(i, i) = bMax[i] - bMin[i];
      }
      snap->setBoundingBox(bBox);
    }

    return snap->getBoundingBox();
  }